

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLCellLinOp::interpolation
          (MLCellLinOp *this,int amrlev,int fmglev,MultiFab *fine,MultiFab *crse)

{
  bool bVar1;
  IntVect *pIVar2;
  int iVar3;
  long lVar4;
  int in_ESI;
  long *in_RDI;
  int kc;
  int jc;
  int ic;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<double> *ffab;
  Array4<const_double> *cfab;
  Box *bx;
  MFIter mfi;
  IntVect ratio;
  Dim3 ratio3;
  int ncomp;
  size_type in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffcb4;
  int in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  int local_340;
  int local_33c;
  int local_338;
  int local_330;
  undefined4 in_stack_fffffffffffffcd4;
  undefined1 do_tiling_;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  MFIter *in_stack_fffffffffffffce0;
  int *piVar5;
  undefined4 in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd14;
  int local_2e0;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  int local_270;
  int local_26c;
  int local_268;
  long *local_250;
  long local_248 [8];
  long *local_208;
  int local_1fc [7];
  int *local_1e0;
  MFIter local_1d8;
  IntVect local_174;
  int local_168 [9];
  int local_144;
  undefined4 local_134;
  IntVect *local_130;
  undefined4 local_124;
  IntVect *local_120;
  undefined4 local_114;
  IntVect *local_110;
  undefined8 local_108;
  int local_100;
  int *local_f8;
  int local_ec;
  int iStack_e8;
  int local_e4;
  undefined8 local_e0;
  int local_d8;
  int *local_d0;
  int local_c4;
  int iStack_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  long *local_a8;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  long *local_90;
  undefined4 local_84;
  int *local_80;
  undefined4 local_74;
  int *local_70;
  undefined4 local_64;
  int *local_60;
  undefined4 local_54;
  int *local_50;
  undefined4 local_44;
  int *local_40;
  undefined4 local_34;
  int *local_30;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  do_tiling_ = (undefined1)((uint)in_stack_fffffffffffffcd4 >> 0x18);
  local_144 = in_ESI;
  local_168[3] = (**(code **)(*in_RDI + 0x28))();
  local_168[0] = 2;
  local_168[1] = 2;
  local_168[2] = 2;
  if (local_144 < 1) {
    pIVar2 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                       ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                        CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                        in_stack_fffffffffffffca8);
    local_174.vect._0_8_ = *(undefined8 *)pIVar2->vect;
    local_174.vect[2] = pIVar2->vect[2];
  }
  else {
    IntVect::IntVect(&local_174,2);
  }
  local_110 = &local_174;
  local_114 = 0;
  local_120 = &local_174;
  local_124 = 1;
  local_168[0] = local_174.vect[0];
  local_168[1] = local_174.vect[1];
  local_130 = &local_174;
  local_134 = 2;
  local_168[2] = local_174.vect[2];
  TilingIfNotGPU();
  MFIter::MFIter(in_stack_fffffffffffffce0,
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                 (bool)do_tiling_);
  while (bVar1 = MFIter::isValid(&local_1d8), bVar1) {
    piVar5 = local_1fc;
    MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    local_1e0 = piVar5;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
               (MFIter *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    local_208 = local_248;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
               (MFIter *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    local_f8 = local_1e0;
    local_30 = local_1e0;
    local_34 = 0;
    local_ec = *local_1e0;
    local_40 = local_1e0;
    local_44 = 1;
    iStack_e8 = local_1e0[1];
    local_108 = *(undefined8 *)local_1e0;
    local_50 = local_1e0;
    local_54 = 2;
    local_100 = local_1e0[2];
    local_d0 = local_1e0;
    local_60 = local_1e0 + 3;
    local_64 = 0;
    local_c4 = *local_60;
    local_70 = local_1e0 + 3;
    local_74 = 1;
    iStack_c0 = local_1e0[4];
    local_e0 = *(undefined8 *)local_60;
    local_80 = local_1e0 + 3;
    local_84 = 2;
    local_d8 = local_1e0[5];
    for (local_2d4 = 0; local_2d8 = local_100, local_2d4 < local_168[3]; local_2d4 = local_2d4 + 1)
    {
      for (; local_2dc = iStack_e8, local_2d8 <= local_d8; local_2d8 = local_2d8 + 1) {
        for (; local_2e0 = local_ec, local_2dc <= iStack_c0; local_2dc = local_2dc + 1) {
          for (; local_2e0 <= local_c4; local_2e0 = local_2e0 + 1) {
            local_8 = local_2e0;
            local_c = local_168[0];
            if (local_168[0] == 1) {
              local_4 = local_2e0;
            }
            else if (local_168[0] == 2) {
              if (local_2e0 < 0) {
                iVar3 = local_2e0 + 1;
                if (iVar3 < 1) {
                  iVar3 = -iVar3;
                }
                local_4 = -iVar3 / 2 + -1;
              }
              else {
                local_4 = local_2e0 / 2;
              }
            }
            else if (local_168[0] == 4) {
              if (local_2e0 < 0) {
                iVar3 = local_2e0 + 1;
                if (iVar3 < 1) {
                  iVar3 = -iVar3;
                }
                local_4 = -iVar3 / 4 + -1;
              }
              else {
                local_4 = local_2e0 / 4;
              }
            }
            else {
              if (local_2e0 < 0) {
                iVar3 = local_2e0 + 1;
                if (iVar3 < 1) {
                  iVar3 = -iVar3;
                }
                local_330 = -iVar3 / local_168[0] + -1;
              }
              else {
                local_330 = local_2e0 / local_168[0];
              }
              local_4 = local_330;
            }
            local_14 = local_2dc;
            local_18 = local_168[1];
            if (local_168[1] == 1) {
              local_10 = local_2dc;
            }
            else if (local_168[1] == 2) {
              if (local_2dc < 0) {
                iVar3 = local_2dc + 1;
                if (iVar3 < 1) {
                  iVar3 = -iVar3;
                }
                local_338 = -iVar3 / 2 + -1;
              }
              else {
                local_338 = local_2dc / 2;
              }
              local_10 = local_338;
            }
            else if (local_168[1] == 4) {
              if (local_2dc < 0) {
                iVar3 = local_2dc + 1;
                if (iVar3 < 1) {
                  iVar3 = -iVar3;
                }
                local_33c = -iVar3 / 4 + -1;
              }
              else {
                local_33c = local_2dc / 4;
              }
              local_10 = local_33c;
            }
            else {
              if (local_2dc < 0) {
                iVar3 = local_2dc + 1;
                if (iVar3 < 1) {
                  iVar3 = -iVar3;
                }
                local_340 = -iVar3 / local_168[1] + -1;
              }
              else {
                local_340 = local_2dc / local_168[1];
              }
              local_10 = local_340;
            }
            local_20 = local_2d8;
            local_24 = local_168[2];
            if (local_168[2] == 1) {
              local_1c = local_2d8;
            }
            else if (local_168[2] == 2) {
              if (local_2d8 < 0) {
                iVar3 = local_2d8 + 1;
                if (iVar3 < 1) {
                  iVar3 = -iVar3;
                }
                in_stack_fffffffffffffcb8 = -iVar3 / 2 + -1;
                local_1c = in_stack_fffffffffffffcb8;
              }
              else {
                in_stack_fffffffffffffcb8 = local_2d8 / 2;
                local_1c = in_stack_fffffffffffffcb8;
              }
            }
            else if (local_168[2] == 4) {
              if (local_2d8 < 0) {
                iVar3 = local_2d8 + 1;
                if (iVar3 < 1) {
                  iVar3 = -iVar3;
                }
                in_stack_fffffffffffffcb4 = -iVar3 / 4 + -1;
                local_1c = in_stack_fffffffffffffcb4;
              }
              else {
                in_stack_fffffffffffffcb4 = local_2d8 / 4;
                local_1c = in_stack_fffffffffffffcb4;
              }
            }
            else if (local_2d8 < 0) {
              iVar3 = local_2d8 + 1;
              if (iVar3 < 1) {
                iVar3 = -iVar3;
              }
              in_stack_fffffffffffffcb0 = -iVar3 / local_168[2] + -1;
              local_1c = in_stack_fffffffffffffcb0;
            }
            else {
              in_stack_fffffffffffffcb0 = local_2d8 / local_168[2];
              local_1c = in_stack_fffffffffffffcb0;
            }
            local_a8 = local_208;
            local_ac = local_4;
            local_b0 = local_10;
            local_b4 = local_1c;
            local_b8 = local_2d4;
            local_94 = local_2e0;
            local_98 = local_2dc;
            local_9c = local_2d8;
            local_a0 = local_2d4;
            lVar4 = (long)(local_2e0 - local_270) + (local_2dc - local_26c) * local_288 +
                    (local_2d8 - local_268) * local_280 + local_2d4 * local_278;
            *(double *)(local_290 + lVar4 * 8) =
                 *(double *)
                  (*local_208 +
                  ((long)(local_4 - (int)local_208[4]) +
                   (long)(local_10 - *(int *)((long)local_208 + 0x24)) * local_208[1] +
                   (long)(local_1c - (int)local_208[5]) * local_208[2] +
                  (long)local_2d4 * local_208[3]) * 8) + *(double *)(local_290 + lVar4 * 8);
            in_stack_fffffffffffffcbc = local_168[2];
            in_stack_fffffffffffffd14 = local_1c;
            local_90 = &local_290;
          }
        }
      }
    }
    local_250 = &local_290;
    local_e4 = local_100;
    local_bc = local_d8;
    MFIter::operator++(&local_1d8);
  }
  MFIter::~MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  return;
}

Assistant:

void
MLCellLinOp::interpolation (int amrlev, int fmglev, MultiFab& fine, const MultiFab& crse) const
{
#ifdef AMREX_SOFT_PERF_COUNTERS
    perf_counters.interpolate(fine);
#endif

    const int ncomp = getNComp();

    Dim3 ratio3 = {2,2,2};
    IntVect ratio = (amrlev > 0) ? IntVect(2) : mg_coarsen_ratio_vec[fmglev];
    AMREX_D_TERM(ratio3.x = ratio[0];,
                 ratio3.y = ratio[1];,
                 ratio3.z = ratio[2];);

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && fine.isFusingCandidate()) {
        auto const& finema = fine.arrays();
        auto const& crsema = crse.const_arrays();
        ParallelFor(fine, IntVect(0), ncomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            int ic = amrex::coarsen(i,ratio3.x);
            int jc = amrex::coarsen(j,ratio3.y);
            int kc = amrex::coarsen(k,ratio3.z);
            finema[box_no](i,j,k,n) += crsema[box_no](ic,jc,kc,n);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(fine,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx    = mfi.tilebox();
            Array4<Real const> const& cfab = crse.const_array(mfi);
            Array4<Real> const& ffab = fine.array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                int ic = amrex::coarsen(i,ratio3.x);
                int jc = amrex::coarsen(j,ratio3.y);
                int kc = amrex::coarsen(k,ratio3.z);
                ffab(i,j,k,n) += cfab(ic,jc,kc,n);
            });
        }
    }
}